

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32
laszip_set_geokeys(laszip_POINTER pointer,laszip_U32 number,laszip_geokey_struct *key_entries)

{
  laszip_I32 lVar1;
  laszip_U8 *data;
  laszip_geokey_struct *key_entries_plus_one;
  laszip_dll_struct *laszip_dll;
  laszip_geokey_struct *key_entries_local;
  laszip_U32 number_local;
  laszip_POINTER pointer_local;
  
  if (pointer == (laszip_POINTER)0x0) {
    pointer_local._4_4_ = 1;
  }
  else if (number == 0) {
    snprintf((char *)((long)pointer + 0x248),0x400,"number of key_entries is zero");
    pointer_local._4_4_ = 1;
  }
  else if (key_entries == (laszip_geokey_struct *)0x0) {
    snprintf((char *)((long)pointer + 0x248),0x400,
             "laszip_geokey_struct pointer \'key_entries\' is zero");
    pointer_local._4_4_ = 1;
  }
  else if (*(long *)((long)pointer + 0x228) == 0) {
    if (*(long *)((long)pointer + 0x238) == 0) {
      data = (laszip_U8 *)operator_new__((ulong)(number + 1) << 3);
      if (data == (laszip_U8 *)0x0) {
        snprintf((char *)((long)pointer + 0x248),0x400,"allocating laszip_geokey_struct[%u] array",
                 (ulong)(number + 1));
        pointer_local._4_4_ = 1;
      }
      else {
        data[0] = '\x01';
        data[1] = '\0';
        data[2] = '\x01';
        data[3] = '\0';
        data[4] = '\0';
        data[5] = '\0';
        key_entries_local._4_2_ = (short)number;
        *(short *)(data + 6) = key_entries_local._4_2_;
        memcpy(data + 8,key_entries,(ulong)number << 3);
        lVar1 = laszip_add_vlr(pointer,"LASF_Projection",0x87af,key_entries_local._4_2_ * 8 + 8,
                               (laszip_CHAR *)0x0,data);
        if (lVar1 == 0) {
          if (data != (laszip_U8 *)0x0) {
            operator_delete__(data);
          }
          *(undefined1 *)((long)pointer + 0x248) = 0;
          pointer_local._4_4_ = 0;
        }
        else {
          snprintf((char *)((long)pointer + 0x248),0x400,"setting %u geodouble_params",(ulong)number
                  );
          if (data != (laszip_U8 *)0x0) {
            operator_delete__(data);
          }
          pointer_local._4_4_ = 1;
        }
      }
    }
    else {
      snprintf((char *)((long)pointer + 0x248),0x400,"cannot set geokeys after writer was opened");
      pointer_local._4_4_ = 1;
    }
  }
  else {
    snprintf((char *)((long)pointer + 0x248),0x400,"cannot set geokeys after reader was opened");
    pointer_local._4_4_ = 1;
  }
  return pointer_local._4_4_;
}

Assistant:

LASZIP_API laszip_I32
laszip_set_geokeys(
    laszip_POINTER                     pointer
    , laszip_U32                       number
    , const laszip_geokey_struct*      key_entries
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (number == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "number of key_entries is zero");
      return 1;
    }

    if (key_entries == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_geokey_struct pointer 'key_entries' is zero");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot set geokeys after reader was opened");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot set geokeys after writer was opened");
      return 1;
    }

    // create the geokey directory

    laszip_geokey_struct* key_entries_plus_one = new laszip_geokey_struct[number+1];
    if (key_entries_plus_one == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "allocating laszip_geokey_struct[%u] array", number+1);
      return 1;
    }
    key_entries_plus_one[0].key_id = 1;            // aka key_directory_version
    key_entries_plus_one[0].tiff_tag_location = 1; // aka key_revision
    key_entries_plus_one[0].count = 0;             // aka minor_revision
    key_entries_plus_one[0].value_offset = number; // aka number_of_keys
    memcpy(key_entries_plus_one + 1, key_entries, sizeof(laszip_geokey_struct)*number);

    // add the VLR

    if (laszip_add_vlr(laszip_dll, "LASF_Projection", 34735, (laszip_U16)(8 + number*8), 0, (laszip_U8*)key_entries_plus_one))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "setting %u geodouble_params", number);
      delete [] key_entries_plus_one;
      return 1;
    }
    delete [] key_entries_plus_one;
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_set_geokey_entries");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}